

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimedata.cpp
# Opt level: O3

QList<QUrl> * __thiscall QMimeData::urls(QList<QUrl> *__return_storage_ptr__,QMimeData *this)

{
  QMimeDataPrivate *this_00;
  int iVar1;
  QMetaType QVar2;
  long lVar3;
  QVariant *this_01;
  long in_FS_OFFSET;
  undefined1 auStack_78 [16];
  undefined1 local_68 [32];
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMimeDataPrivate *)(this->super_QObject).d_ptr.d;
  local_48._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = (QArrayData *)0x0;
  local_68._8_8_ = L"text/uri-list";
  local_68._16_8_ = (undefined1 *)0xd;
  QMetaType::QMetaType((QMetaType *)(auStack_78 + 8),9);
  QMimeDataPrivate::retrieveTypedData
            ((QVariant *)&local_48,this_00,(QString *)local_68,(QMetaType)auStack_78._8_8_);
  if ((QArrayData *)local_68._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_68._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QUrl *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QVar2 = ::QVariant::metaType((QVariant *)&local_48);
  if (QVar2.d_ptr != (QMetaTypeInterface *)0x0) {
    iVar1 = ((QVar2.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar1 == 0) {
      iVar1 = QMetaType::registerHelper(QVar2.d_ptr);
    }
    if (iVar1 == 0x11) {
      ::QVariant::toUrl((QVariant *)local_68);
      QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                ((QMovableArrayOps<QUrl> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
                 (QUrl *)local_68);
      QList<QUrl>::end(__return_storage_ptr__);
      QUrl::~QUrl((QUrl *)local_68);
      goto LAB_002ac85b;
    }
  }
  QVar2 = ::QVariant::metaType((QVariant *)&local_48);
  if (QVar2.d_ptr != (QMetaTypeInterface *)0x0) {
    iVar1 = ((QVar2.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar1 == 0) {
      iVar1 = QMetaType::registerHelper(QVar2.d_ptr);
    }
    if (iVar1 == 9) {
      local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      ::QVariant::toList((QVariantList *)local_68,(QVariant *)&local_48);
      if ((undefined1 *)local_68._16_8_ != (undefined1 *)0x0) {
        lVar3 = local_68._16_8_ << 5;
        this_01 = (QVariant *)local_68._8_8_;
        do {
          QVar2 = ::QVariant::metaType(this_01);
          if (QVar2.d_ptr != (QMetaTypeInterface *)0x0) {
            iVar1 = ((QVar2.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
            if (iVar1 == 0) {
              iVar1 = QMetaType::registerHelper(QVar2.d_ptr);
            }
            if (iVar1 == 0x11) {
              ::QVariant::toUrl((QVariant *)auStack_78);
              QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
                        ((QMovableArrayOps<QUrl> *)__return_storage_ptr__,
                         (__return_storage_ptr__->d).size,(QUrl *)auStack_78);
              QList<QUrl>::end(__return_storage_ptr__);
              QUrl::~QUrl((QUrl *)auStack_78);
            }
          }
          this_01 = this_01 + 1;
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != 0);
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_68);
    }
  }
LAB_002ac85b:
  ::QVariant::~QVariant((QVariant *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QUrl> QMimeData::urls() const
{
    Q_D(const QMimeData);
    QVariant data = d->retrieveTypedData(textUriListLiteral(), QMetaType(QMetaType::QVariantList));
    QList<QUrl> urls;
    if (data.metaType().id() == QMetaType::QUrl)
        urls.append(data.toUrl());
    else if (data.metaType().id() == QMetaType::QVariantList) {
        const QList<QVariant> list = data.toList();
        for (const auto &element : list) {
            if (element.metaType().id() == QMetaType::QUrl)
                urls.append(element.toUrl());
        }
    }
    return urls;
}